

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poll.cpp
# Opt level: O0

void __thiscall Poll::notify_subscriber_changed(Poll *this,Subscriber *listener)

{
  bool bVar1;
  short sVar2;
  int iVar3;
  reference ppVar4;
  pollfd *fd;
  iterator __end1;
  iterator __begin1;
  vector<pollfd,_std::allocator<pollfd>_> *__range1;
  int initial_fd;
  Subscriber *listener_local;
  Poll *this_local;
  
  bVar1 = Subscriber::is_dirty(listener);
  if (bVar1) {
    iVar3 = Subscriber::get_fd(listener);
    if (iVar3 < 1) {
      iVar3 = -iVar3;
    }
    __end1 = std::vector<pollfd,_std::allocator<pollfd>_>::begin(&this->fds);
    fd = (pollfd *)std::vector<pollfd,_std::allocator<pollfd>_>::end(&this->fds);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<pollfd_*,_std::vector<pollfd,_std::allocator<pollfd>_>_>
                                       *)&fd), bVar1) {
      ppVar4 = __gnu_cxx::__normal_iterator<pollfd_*,_std::vector<pollfd,_std::allocator<pollfd>_>_>
               ::operator*(&__end1);
      if (ppVar4->fd == iVar3) {
        iVar3 = Subscriber::get_fd(listener);
        ppVar4->fd = iVar3;
        sVar2 = Subscriber::get_mask(listener);
        ppVar4->events = sVar2;
        Subscriber::set_dirty(listener,false);
        return;
      }
      __gnu_cxx::__normal_iterator<pollfd_*,_std::vector<pollfd,_std::allocator<pollfd>_>_>::
      operator++(&__end1);
    }
  }
  return;
}

Assistant:

void Poll::notify_subscriber_changed(Subscriber &listener) {
  if (!listener.is_dirty()) return;
  int initial_fd = abs(listener.get_fd());
  for (auto &fd: fds) {
    if (fd.fd == initial_fd) {
      fd.fd = listener.get_fd();
      fd.events = listener.get_mask();
      listener.set_dirty(false);
      break;
    }
  }
}